

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.h
# Opt level: O3

void TadsHttpRequestHeader::fix_multiline_headers(StringRef *hdrs,int start_ofs)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  long lVar9;
  
  pcVar7 = hdrs->str;
  lVar4 = hdrs->len;
  pcVar6 = pcVar7 + start_ofs;
  if (start_ofs < lVar4) {
    pcVar8 = pcVar6;
    do {
      cVar1 = *pcVar6;
      if (cVar1 == '\n') {
LAB_002057e9:
        *pcVar8 = ' ';
        pcVar6 = pcVar6 + 1;
LAB_002057fe:
        pcVar8 = pcVar8 + 1;
      }
      else {
        if (cVar1 != '\r') {
          pcVar6 = pcVar6 + 1;
          *pcVar8 = cVar1;
          goto LAB_002057fe;
        }
        if (pcVar6[1] != '\n') goto LAB_002057e9;
        cVar1 = pcVar6[2];
        uVar5 = 0;
        if ((cVar1 != '\0') && (cVar1 != '\r')) {
          uVar5 = (uint)(cVar1 != '\n');
        }
        iVar3 = isspace(uVar5);
        if (iVar3 != 0) {
          *pcVar8 = ' ';
          pcVar2 = pcVar6 + 2;
          do {
            pcVar6 = pcVar2;
            cVar1 = *pcVar6;
            iVar3 = isspace((int)cVar1);
            if ((iVar3 == 0) || (cVar1 == '\n')) break;
            pcVar2 = pcVar6 + 1;
          } while (cVar1 != '\r');
          goto LAB_002057fe;
        }
        *pcVar8 = '\r';
        pcVar8[1] = pcVar6[1];
        pcVar8 = pcVar8 + 2;
        pcVar6 = pcVar6 + 2;
      }
    } while (pcVar6 < pcVar7 + lVar4);
    pcVar7 = hdrs->str;
    lVar4 = hdrs->len;
    pcVar6 = pcVar8;
  }
  lVar9 = (long)pcVar6 - (long)pcVar7;
  if (lVar9 < lVar4) {
    hdrs->len = lVar9;
    pcVar7[lVar9] = '\0';
  }
  return;
}

Assistant:

static void fix_multiline_headers(StringRef *hdrs, int start_ofs)
    {
        /*
         *   Look for CR LF <space>+ <^space> sequences, and delete the line
         *   breaks in each one.  
         */
        char *p, *dst, *endp = hdrs->getend();
        for (dst = p = hdrs->get() + start_ofs ; p < endp ; )
        {
            /* check for a line break */
            if (*p == '\r' && *(p+1) == '\n')
            {
                /* 
                 *   if the next line starts with whitespace, it's a
                 *   continuation line; otherwise it's a new header 
                 */
                if (isspace(*(p+2) && *(p+2) != '\r' && *(p+2) != '\n'))
                {
                    /* 
                     *   it's a continuation line - replace the CR-LF with a
                     *   single space, then skip all of the whitespace at the
                     *   start of this line 
                     */
                    *dst++ = ' ';
                    for (p += 2 ; isspace(*p) && *p != '\r' && *p != '\n' ;
                         ++p) ;
                }
                else
                {
                    /* it's not a continuation line, so copy it as-is */
                    *dst++ = *p++;
                    *dst++ = *p++;
                }
            }
            else if (*p == '\r' || *p == '\n')
            {
                /* unpaired CR or LF - convert it to a space */
                *dst++ = ' ';
                ++p;
            }
            else
            {
                /* ordinary character - copy it unchanged */
                *dst++ = *p++;
            }
        }
        
        /* set the new size of the headers */
        hdrs->truncate(dst - hdrs->get());
    }